

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameTranslator.cpp
# Opt level: O1

Expression * __thiscall IRT::FrameTranslator::GetField(FrameTranslator *this,string *name)

{
  int iVar1;
  mapped_type *pmVar2;
  undefined4 extraout_var;
  ClassStorage *pCVar3;
  pointer extraout_RAX;
  pointer pcVar4;
  mapped_type *pmVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  MemExpression *this_00;
  BinopExpression *this_01;
  ConstExpression *this_02;
  runtime_error *this_03;
  _Elt_pointer ppAVar7;
  pointer this_04;
  bool bVar8;
  vector<Symbol,_std::allocator<Symbol>_> field_names;
  undefined1 local_110 [56];
  string *local_d8;
  long local_d0;
  ulong local_c8;
  string local_c0;
  Expression *local_a0;
  FrameTranslator *local_98;
  Symbol *local_90;
  Symbol local_88;
  vector<Symbol,_std::allocator<Symbol>_> local_68;
  string local_50;
  
  local_110._0_8_ = local_110 + 0x10;
  local_d8 = name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"this","");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->addresses_,(key_type *)local_110);
  ppAVar7 = (pmVar2->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar7 ==
      (pmVar2->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar7 = (pmVar2->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  iVar1 = (*ppAVar7[-1]->_vptr_Address[2])();
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  pCVar3 = ClassStorage::GetInstance();
  pcVar4 = (this->class_name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + (this->class_name_)._M_string_length);
  Symbol::Symbol((Symbol *)local_110,&local_50);
  ClassStorage::GetFieldsNames(&local_68,pCVar3,(Symbol *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  local_a0 = (Expression *)CONCAT44(extraout_var,iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_90 = local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar6 = 0;
    iVar1 = 0;
  }
  else {
    local_d0 = 0;
    local_c8 = 0;
    this_04 = local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_98 = this;
    do {
      Symbol::GetName_abi_cxx11_((string *)local_110,this_04);
      if (local_110._8_8_ == local_d8->_M_string_length) {
        if (local_110._8_8_ == 0) {
          bVar8 = true;
        }
        else {
          iVar1 = bcmp((void *)local_110._0_8_,(local_d8->_M_dataplus)._M_p,local_110._8_8_);
          bVar8 = iVar1 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      pcVar4 = local_110 + 0x10;
      if ((pointer)local_110._0_8_ != pcVar4) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        pcVar4 = extraout_RAX;
      }
      if (bVar8) {
        local_c8 = CONCAT71((int7)((ulong)pcVar4 >> 8),1);
      }
      else {
        pCVar3 = ClassStorage::GetInstance();
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        pcVar4 = (local_98->class_name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar4,pcVar4 + (local_98->class_name_)._M_string_length);
        Symbol::Symbol(&local_88,&local_c0);
        ClassStorage::GetFields
                  ((unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
                    *)local_110,pCVar3,&local_88);
        pmVar5 = std::__detail::
                 _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_110,this_04);
        iVar1 = (*(((pmVar5->super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   )->super_Object)._vptr_Object[3])();
        std::
        _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name_._M_dataplus._M_p != &local_88.name_.field_2) {
          operator_delete(local_88.name_._M_dataplus._M_p,
                          local_88.name_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        local_d0 = local_d0 + CONCAT44(extraout_var_00,iVar1);
      }
      this_04 = this_04 + 1;
    } while (!bVar8 && this_04 != local_90);
    iVar1 = (int)local_d0;
    uVar6 = local_c8;
  }
  if ((uVar6 & 1) != 0) {
    this_00 = (MemExpression *)operator_new(0x10);
    this_01 = (BinopExpression *)operator_new(0x20);
    this_02 = (ConstExpression *)operator_new(0x10);
    ConstExpression::ConstExpression(this_02,iVar1);
    BinopExpression::BinopExpression(this_01,PLUS,local_a0,(Expression *)this_02);
    MemExpression::MemExpression(this_00,(Expression *)this_01);
    std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_68);
    return &this_00->super_Expression;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 "Undeclared field: ",local_d8);
  std::runtime_error::runtime_error(this_03,(string *)local_110);
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IRT::Expression* FrameTranslator::GetField(const std::string& name) {
  IRT::Expression* this_ptr = addresses_["this"].top()->ToExpression();
  IRT::Expression* field_ptr;

  auto field_names =
      ClassStorage::GetInstance().GetFieldsNames(Symbol(class_name_));
  bool is_found = false;
  size_t offset = 0;

  for (auto&& field : field_names) {
    if (field.GetName() == name) {
      is_found = true;
      break;
    }
    offset += ClassStorage::GetInstance()
                  .GetFields(Symbol(class_name_))[field]
                  ->GetSize();
  }
  if (is_found) {
    field_ptr = new MemExpression(new BinopExpression(
        BinaryOperatorType::PLUS, this_ptr, new ConstExpression(offset)));
  } else {
    throw std::runtime_error("Undeclared field: " + name);
  }

  return field_ptr;
}